

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_reader.h
# Opt level: O1

string_view __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeReader::Next(CordRepBtreeReader *this)

{
  byte bVar1;
  CordRepBtree *pCVar2;
  CordRep *pCVar3;
  size_t sVar4;
  CordRepBtree CVar5;
  size_t sVar6;
  uint8_t *puVar7;
  CordRep *pCVar8;
  string_view sVar9;
  
  if (this->remaining_ == 0) {
    sVar4 = 0;
    puVar7 = (uint8_t *)0x0;
  }
  else {
    pCVar2 = (this->navigator_).node_[0];
    bVar1 = (this->navigator_).index_[0];
    if ((ulong)(byte)pCVar2[0xf] - 1 == (ulong)bVar1) {
      pCVar3 = CordRepBtreeNavigator::NextUp(&this->navigator_);
    }
    else {
      CVar5 = (CordRepBtree)(bVar1 + 1);
      (this->navigator_).index_[0] = (uint8_t)CVar5;
      if ((byte)CVar5 < (byte)pCVar2[0xe]) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((byte)pCVar2[0xf] <= (byte)CVar5) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      pCVar3 = *(CordRep **)(pCVar2 + (ulong)(byte)CVar5 * 8 + 0x10);
    }
    if (pCVar3 == (CordRep *)0x0) {
      __assert_fail("edge != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_reader.h"
                    ,0xb1,"absl::string_view absl::cord_internal::CordRepBtreeReader::Next()");
    }
    sVar4 = pCVar3->length;
    this->remaining_ = this->remaining_ - sVar4;
    bVar1 = pCVar3->tag;
    if (bVar1 < 5) {
      pCVar8 = pCVar3;
      if (bVar1 == 1) {
        pCVar8 = *(CordRep **)&pCVar3[1].refcount;
      }
      if (pCVar8->tag < 5) {
        __assert_fail("IsDataEdge(edge)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_data_edge.h"
                      ,0x2e,"absl::string_view absl::cord_internal::EdgeData(const CordRep *)");
      }
    }
    if (bVar1 == 1) {
      sVar6 = pCVar3[1].length;
      pCVar3 = *(CordRep **)&pCVar3[1].refcount;
    }
    else {
      sVar6 = 0;
    }
    bVar1 = pCVar3->tag;
    if (bVar1 < 6) {
      if (bVar1 != 5) {
        __assert_fail("IsExternal()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x369,"const CordRepExternal *absl::cord_internal::CordRep::external() const"
                     );
      }
      puVar7 = (uint8_t *)pCVar3[1].length;
    }
    else {
      if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
        __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                      ,0xbb,"const CordRepFlat *absl::cord_internal::CordRep::flat() const");
      }
      puVar7 = pCVar3->storage;
    }
    puVar7 = puVar7 + sVar6;
  }
  sVar9._M_str = (char *)puVar7;
  sVar9._M_len = sVar4;
  return sVar9;
}

Assistant:

inline absl::string_view CordRepBtreeReader::Next() {
  if (remaining_ == 0) return {};
  const CordRep* edge = navigator_.Next();
  assert(edge != nullptr);
  remaining_ -= edge->length;
  return EdgeData(edge);
}